

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::LiteBasicTest_AllLite23_Test::~LiteBasicTest_AllLite23_Test
          (LiteBasicTest_AllLite23_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LiteBasicTest, AllLite23) {
  {
    // SwapWithOther
    proto2_unittest::TestMapLite message1, message2;

    MapTestUtil::SetMapFields(&message1);
    MapTestUtil::SetMapFields(&message2);
    MapTestUtil::ModifyMapFields(&message2);

    message1.Swap(&message2);
    MapTestUtil::ExpectMapFieldsModified(message1);
    MapTestUtil::ExpectMapFieldsSet(message2);
  }
}